

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.cpp
# Opt level: O0

void __thiscall so_5::agent_t::do_state_switch(agent_t *this,state_t *state_to_be_set)

{
  anon_class_40_5_3dd2e56f lambda;
  ulong uVar1;
  unsigned_long *puVar2;
  reference ppsVar3;
  value_type in_stack_fffffffffffffe90;
  size_t local_130;
  size_t local_128;
  ulong local_120;
  size_t first_diff;
  path_t new_path;
  path_t old_path;
  state_t *state_to_be_set_local;
  agent_t *this_local;
  
  state_t::fill_path(this->m_current_state_ptr,(path_t *)(new_path._M_elems + 0xf));
  state_t::fill_path(state_to_be_set,(path_t *)&first_diff);
  local_120 = 0;
  while( true ) {
    uVar1 = local_120;
    local_128 = state_t::nested_level(this->m_current_state_ptr);
    local_130 = state_t::nested_level(state_to_be_set);
    puVar2 = std::min<unsigned_long>(&local_128,&local_130);
    if (*puVar2 <= uVar1) break;
    ppsVar3 = std::array<const_so_5::state_t_*,_16UL>::operator[]
                        ((array<const_so_5::state_t_*,_16UL> *)(new_path._M_elems + 0xf),local_120);
    in_stack_fffffffffffffe90 = *ppsVar3;
    ppsVar3 = std::array<const_so_5::state_t_*,_16UL>::operator[]
                        ((array<const_so_5::state_t_*,_16UL> *)&first_diff,local_120);
    if (in_stack_fffffffffffffe90 != *ppsVar3) break;
    local_120 = local_120 + 1;
  }
  lambda.first_diff = (size_t *)(new_path._M_elems + 0xf);
  lambda.this = (agent_t *)&local_120;
  lambda.old_path = (path_t *)state_to_be_set;
  lambda.state_to_be_set = (state_t *)&first_diff;
  lambda.new_path = (path_t *)in_stack_fffffffffffffe90;
  details::invoke_noexcept_code<so_5::agent_t::do_state_switch(so_5::state_t_const&)::__0>(lambda);
  this->m_current_state_ptr = state_to_be_set;
  state_t::update_history_in_parent_states(this->m_current_state_ptr);
  return;
}

Assistant:

void
agent_t::do_state_switch(
	const state_t & state_to_be_set )
{
	state_t::path_t old_path;
	state_t::path_t new_path;

	m_current_state_ptr->fill_path( old_path );
	state_to_be_set.fill_path( new_path );

	// Find the first item which is different in the paths.
	std::size_t first_diff = 0;
	for(; first_diff < std::min(
				m_current_state_ptr->nested_level(),
				state_to_be_set.nested_level() );
			++first_diff )
		if( old_path[ first_diff ] != new_path[ first_diff ] )
			break;

	// Do call for on_exit and on_enter for states.
	// on_exit and on_enter should not throw exceptions.
	so_5::details::invoke_noexcept_code( [&] {

		impl::msg_tracing_helpers::safe_trace_state_leaving(
				*this, *m_current_state_ptr );
		for( std::size_t i = m_current_state_ptr->nested_level();
				i >= first_diff; )
			{
				old_path[ i ]->call_on_exit();
				if( i )
					--i;
				else
					break;
			}

		impl::msg_tracing_helpers::safe_trace_state_entering(
				*this, state_to_be_set );
		for( std::size_t i = first_diff;
				i <= state_to_be_set.nested_level();
				++i )
			{
				new_path[ i ]->call_on_enter();
			}
	} );

	// Now the current state for the agent can be changed.
	m_current_state_ptr = &state_to_be_set;
	m_current_state_ptr->update_history_in_parent_states();
}